

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O1

smf_tempo_t * smf_get_tempo_by_pulses(smf_t *smf,int pulses)

{
  GPtrArray *pGVar1;
  smf_tempo_t *psVar2;
  guint number;
  
  if (pulses < 0) {
    __assert_fail("pulses >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x114,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
  }
  pGVar1 = smf->tempo_array;
  if (pulses == 0) {
    if (pGVar1->len == 0) {
LAB_0010f82c:
      psVar2 = (smf_tempo_t *)0x0;
    }
    else {
      psVar2 = (smf_tempo_t *)*pGVar1->pdata;
    }
  }
  else {
    if (pGVar1 == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x119,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
    }
    number = pGVar1->len;
    do {
      number = number - 1;
      if ((int)number < 0) goto LAB_0010f82c;
      psVar2 = smf_get_tempo_by_number(smf,number);
      if (psVar2 == (smf_tempo_t *)0x0) {
        __assert_fail("tempo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                      ,0x11e,"smf_tempo_t *smf_get_tempo_by_pulses(const smf_t *, int)");
      }
    } while (pulses <= psVar2->time_pulses);
  }
  return psVar2;
}

Assistant:

smf_tempo_t *
smf_get_tempo_by_pulses(const smf_t *smf, int pulses)
{
	int i;
	smf_tempo_t *tempo;

	assert(pulses >= 0);

	if (pulses == 0)
		return (smf_get_tempo_by_number(smf, 0));

	assert(smf->tempo_array != NULL);
	
	for (i = smf->tempo_array->len - 1; i >= 0; i--) {
		tempo = smf_get_tempo_by_number(smf, i);

		assert(tempo);
		if (tempo->time_pulses < pulses)
			return (tempo);
	}

	return (NULL);
}